

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

_Bool f64_is_zon2(union_float64 a,union_float64 b)

{
  double dVar1;
  int local_60;
  _Bool local_59;
  int local_48;
  int local_2c;
  int local_1c;
  union_float64 b_local;
  union_float64 a_local;
  
  local_1c = 2;
  if (((a.h != 0.0) || (NAN(a.h))) && (local_1c = 0, !NAN(a.h))) {
    dVar1 = ABS(a.h);
    local_1c = 1;
    if (((dVar1 != INFINITY) || (NAN(dVar1))) && (local_1c = 3, 2.2250738585072014e-308 <= dVar1)) {
      local_1c = 4;
    }
  }
  if (local_1c != 4) {
    local_2c = 2;
    if (((a.h != 0.0) || (NAN(a.h))) && (local_2c = 0, !NAN(a.h))) {
      dVar1 = ABS(a.h);
      local_2c = 1;
      if (((dVar1 != INFINITY) || (NAN(dVar1))) && (local_2c = 3, 2.2250738585072014e-308 <= dVar1))
      {
        local_2c = 4;
      }
    }
    if (local_2c != 2) {
      return false;
    }
  }
  local_48 = 2;
  if (((b.h != 0.0) || (NAN(b.h))) && (local_48 = 0, !NAN(b.h))) {
    dVar1 = ABS(b.h);
    local_48 = 1;
    if (((dVar1 != INFINITY) || (NAN(dVar1))) && (local_48 = 3, 2.2250738585072014e-308 <= dVar1)) {
      local_48 = 4;
    }
  }
  local_59 = true;
  if (local_48 != 4) {
    local_60 = 2;
    if (((b.h != 0.0) || (NAN(b.h))) && (local_60 = 0, !NAN(b.h))) {
      dVar1 = ABS(b.h);
      local_60 = 1;
      if (((dVar1 != INFINITY) || (NAN(dVar1))) && (local_60 = 3, 2.2250738585072014e-308 <= dVar1))
      {
        local_60 = 4;
      }
    }
    local_59 = local_60 == 2;
  }
  return local_59;
}

Assistant:

static inline bool f64_is_zon2(union_float64 a, union_float64 b)
{
    if (QEMU_HARDFLOAT_2F64_USE_FP) {
        return (fpclassify(a.h) == FP_NORMAL || fpclassify(a.h) == FP_ZERO) &&
               (fpclassify(b.h) == FP_NORMAL || fpclassify(b.h) == FP_ZERO);
    }
    return float64_is_zero_or_normal(a.s) &&
           float64_is_zero_or_normal(b.s);
}